

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::Point::Jacobian(MatrixXd *__return_storage_ptr__,Point *this,MatrixXd *local)

{
  uint uVar1;
  ConstantReturnType local_38;
  MatrixXd *local_20;
  MatrixXd *local_local;
  Point *this_local;
  
  local_20 = local;
  local_local = (MatrixXd *)this;
  this_local = (Point *)__return_storage_ptr__;
  uVar1 = (*(this->super_Geometry)._vptr_Geometry[1])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(&local_38,(ulong)uVar1,0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Point::Jacobian(const Eigen::MatrixXd& local) const {
  return Eigen::MatrixXd::Zero(DimGlobal(), 0);
}